

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLut.c
# Opt level: O3

int Sbl_ManEvaluateMapping(Sbl_Man_t *p,int DelayGlo)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  timespec ts;
  timespec local_40;
  
  uVar7 = (ulong)(uint)DelayGlo;
  iVar1 = clock_gettime(3,&local_40);
  if (iVar1 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  if (p->pGia->vEdge1 == (Vec_Int_t *)0x0) {
    p->vPath->nSize = 0;
    Sbl_ManCreateTiming(p,DelayGlo);
    Sbl_ManGetCurrentMapping(p);
    pVVar3 = p->vAnds;
    if (pVVar3->nSize < 1) {
      uVar9 = 0xffffffff;
    }
    else {
      lVar6 = 0;
      lVar8 = 0;
      do {
        if (p->vWindow->nSize <= lVar8) goto LAB_007542ca;
        uVar2 = pVVar3->pArray[lVar8];
        uVar9 = (ulong)uVar2;
        iVar1 = Sbl_ManComputeDelay(p,(int)uVar7,
                                    (Vec_Int_t *)((long)&p->vWindow->pArray->nCap + lVar6));
        if (((int)uVar2 < 0) || (p->vArrs->nSize <= (int)uVar2)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        p->vArrs->pArray[uVar9] = iVar1;
        lVar8 = lVar8 + 1;
        pVVar3 = p->vAnds;
        lVar6 = lVar6 + 0x10;
      } while (lVar8 < pVVar3->nSize);
    }
    uVar2 = p->vRoots->nSize;
    if ((int)uVar2 < 1) {
      uVar7 = 0;
    }
    else {
      uVar7 = 0;
      do {
        iVar1 = p->vRoots->pArray[uVar7];
        uVar9 = (ulong)iVar1;
        if ((((long)uVar9 < 0) || (p->vArrs->nSize <= iVar1)) || (p->vReqs->nSize <= iVar1))
        goto LAB_007542ab;
        if (p->vReqs->pArray[uVar9] < p->vArrs->pArray[uVar9]) goto LAB_00754143;
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
      uVar7 = (ulong)uVar2;
    }
LAB_00754143:
    iVar1 = clock_gettime(3,&local_40);
    if (iVar1 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
    }
    p->timeTime = p->timeTime + lVar6 + lVar5;
    iVar1 = 1;
    if ((int)uVar7 != p->vRoots->nSize) {
      uVar4 = (ulong)p->vAnds->nSize;
      if (0 < (long)uVar4) {
        iVar1 = 1;
        uVar10 = 0;
        do {
          if (p->vAnds->pArray[uVar10] == (int)uVar9) {
            if ((int)uVar7 < p->vRootVars->nSize) {
              if (p->vRootVars->pArray[uVar7 & 0xffffffff] != (int)uVar10) {
                __assert_fail("iAnd == Vec_IntEntry(p->vRootVars, i)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                              ,0x1f5,"int Sbl_ManEvaluateMapping(Sbl_Man_t *, int)");
              }
              while( true ) {
                Vec_IntPush(p->vPath,iVar1);
                if (p->vWindow->nSize <= (int)uVar10) break;
                uVar2 = Sbl_ManCriticalFanin
                                  (p,(int)uVar9,p->vWindow->pArray + (uVar10 & 0xffffffff));
                if ((int)uVar2 < 1) {
                  __assert_fail("iLut > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                                ,0x1fd,"int Sbl_ManEvaluateMapping(Sbl_Man_t *, int)");
                }
                uVar9 = (ulong)uVar2;
                uVar7 = (ulong)p->vAnds->nSize;
                if ((long)uVar7 < 1) {
                  return 0;
                }
                iVar1 = 1;
                uVar10 = 0;
                while (p->vAnds->pArray[uVar10] != uVar2) {
                  uVar10 = uVar10 + 1;
                  iVar1 = iVar1 + 2;
                  if (uVar7 == uVar10) {
                    return 0;
                  }
                }
              }
LAB_007542ca:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                            ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
            }
LAB_007542ab:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar10 = uVar10 + 1;
          iVar1 = iVar1 + 2;
        } while (uVar4 != uVar10);
      }
      __assert_fail("iAnd >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSatLut.c"
                    ,499,"int Sbl_ManEvaluateMapping(Sbl_Man_t *, int)");
    }
  }
  else {
    iVar1 = Sbl_ManEvaluateMappingEdge(p,DelayGlo);
  }
  return iVar1;
}

Assistant:

int Sbl_ManEvaluateMapping( Sbl_Man_t * p, int DelayGlo )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vFanins;
    int i, iLut = -1, iAnd, Delay, Required;
    if ( p->pGia->vEdge1 )
        return Sbl_ManEvaluateMappingEdge( p, DelayGlo );
    Vec_IntClear( p->vPath );
    // derive timing
    Sbl_ManCreateTiming( p, DelayGlo );
    // update new timing
    Sbl_ManGetCurrentMapping( p );
    Vec_IntForEachEntry( p->vAnds, iLut, i )
    {
        vFanins = Vec_WecEntry( p->vWindow, i );
        Delay   = Sbl_ManComputeDelay( p, iLut, vFanins );
        Vec_IntWriteEntry( p->vArrs, iLut, Delay );
    }
    // compare timing at the root nodes
    Vec_IntForEachEntry( p->vRoots, iLut, i )
    {
        Delay    = Vec_IntEntry( p->vArrs, iLut );
        Required = Vec_IntEntry( p->vReqs, iLut );
        if ( Delay > Required ) // updated timing exceeded original timing
            break;
    }
    p->timeTime += Abc_Clock() - clk;
    if ( i == Vec_IntSize(p->vRoots) )
        return 1;
    // derive the critical path

    // find SAT variable of the node whose GIA ID is "iLut"
    iAnd = Vec_IntFind( p->vAnds, iLut );
    assert( iAnd >= 0 );
    // critical path begins in node "iLut", which is i-th root of the window
    assert( iAnd == Vec_IntEntry(p->vRootVars, i) );
    while ( 1 )
    {
        Vec_IntPush( p->vPath, Abc_Var2Lit(iAnd, 1) );
        // find fanins of this node
        vFanins = Vec_WecEntry( p->vWindow, iAnd );
        // find critical fanin
        iLut = Sbl_ManCriticalFanin( p, iLut, vFanins );
        assert( iLut > 0  );
        // find SAT variable of the node whose GIA ID is "iLut"
        iAnd = Vec_IntFind( p->vAnds, iLut );
        if ( iAnd == -1 )
            break;
    }
    return 0;
}